

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryReadWithFds
          (BlockedWrite *this,void *buffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  *this_00;
  unsigned_long uVar1;
  FixVoid<kj::AsyncCapabilityStream::ReadResult> value;
  bool bVar2;
  Tag TVar3;
  int osErrorNumber;
  Tag TVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  Exception *this_01;
  size_t sVar7;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  *pOVar8;
  unsigned_long in_stack_00000008;
  undefined1 local_1a0 [16];
  Retry *_kj_switch_done_3;
  Retry *retry;
  Maybe<kj::AsyncCapabilityStream_&> local_180;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  *local_178;
  AsyncCapabilityStream *local_170;
  Done *_kj_switch_done_2;
  Done *done;
  undefined1 local_138 [8];
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
  _kj_switch_subject;
  Fault local_e8;
  Fault f_1;
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *_kj_switch_done_1;
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *streams;
  Fault local_c0;
  Fault f;
  SyscallResult local_9c;
  undefined1 local_98 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  unsigned_long i;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_long> *__range5;
  ArrayPtr<const_int> *local_58;
  ArrayPtr<const_int> *_kj_switch_done;
  ArrayPtr<const_int> *fds;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  *_kj_switch_subject_1;
  size_t capCount;
  OwnFd *fdBuffer_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  BlockedWrite *this_local;
  
  _kj_switch_subject_1 =
       (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
        *)0x0;
  capCount = maxFds;
  fdBuffer_local = fdBuffer;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  fds = (ArrayPtr<const_int> *)
        OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
        ::_switchSubject((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                          *)((long)buffer + 0x40));
  TVar3 = OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
          ::which((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                   *)fds);
  if (TVar3 == _variant0) {
    local_58 = OneOf<kj::ArrayPtr<int_const>,kj::Array<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
               ::get<kj::ArrayPtr<int_const>>
                         ((OneOf<kj::ArrayPtr<int_const>,kj::Array<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                           *)fds);
    _kj_switch_done = local_58;
    while (local_58 != (ArrayPtr<const_int> *)0x0) {
      __range5 = (Range<unsigned_long> *)ArrayPtr<const_int>::size(_kj_switch_done);
      _kj_switch_subject_1 =
           (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
            *)max<unsigned_long,unsigned_long&>((unsigned_long *)&__range5,&stack0x00000008);
      ___begin5 = zeroTo<unsigned_long>((unsigned_long)_kj_switch_subject_1);
      __end5 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin5);
      i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin5);
      while (bVar2 = Range<unsigned_long>::Iterator::operator==(&__end5,(Iterator *)&i),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        puVar5 = Range<unsigned_long>::Iterator::operator*(&__end5);
        uVar1 = *puVar5;
        f.exception = (Exception *)local_98;
        local_9c = kj::_::Debug::
                   syscall<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda()_1_>
                             ((anon_class_24_3_36d9a5e8 *)&f,false);
        pvVar6 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_9c);
        if (pvVar6 == (void *)0x0) {
          osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_9c);
          kj::_::Debug::Fault::Fault
                    (&local_c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0x202,osErrorNumber,"_kj_fd = dup(fds[i])","");
          kj::_::Debug::Fault::fatal(&local_c0);
        }
        OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_98);
        OwnFd::operator=((OwnFd *)(capCount + uVar1 * 4),(OwnFd *)&_kjSyscallResult);
        OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
        Range<unsigned_long>::Iterator::operator++(&__end5);
      }
      capCount = (long)_kj_switch_subject_1 * 4 + capCount;
      in_stack_00000008 = in_stack_00000008 - (long)_kj_switch_subject_1;
      local_58 = (ArrayPtr<const_int> *)0x0;
    }
  }
  else if (TVar3 == _variant1) {
    this_01 = (Exception *)
              OneOf<kj::ArrayPtr<int_const>,kj::Array<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
              ::get<kj::Array<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                        ((OneOf<kj::ArrayPtr<int_const>,kj::Array<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>>
                          *)fds);
    f_1.exception = this_01;
    while (f_1.exception != (Exception *)0x0) {
      sVar7 = Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::size
                        ((Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *)this_01);
      if ((sVar7 != 0) && (in_stack_00000008 != 0)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                  (&local_e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x20d,FAILED,(char *)0x0,
                   "\"async pipe message was written with streams attached, but corresponding read \" \"asked for FDs, and we don\'t know how to convert here\""
                   ,(char (*) [130])
                    "async pipe message was written with streams attached, but corresponding read asked for FDs, and we don\'t know how to convert here"
                  );
        kj::_::Debug::Fault::fatal(&local_e8);
      }
      f_1.exception = (Exception *)0x0;
    }
  }
  this_00 = (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             *)((long)&_kj_switch_subject.field_1.value.field_1 + 0x18);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  OneOf(this_00);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  operator=((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
             *)((long)buffer + 0x40),this_00);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  ~OneOf((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
          *)((long)&_kj_switch_subject.field_1.value.field_1 + 0x18));
  tryReadImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
               *)&done,(BlockedWrite *)buffer,(void *)minBytes_local,maxBytes_local,
              (size_t)fdBuffer_local);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  ::_switchSubject((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                    *)local_138,
                   (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
                    *)&done);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  ::~OneOf((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
            *)&done);
  pOVar8 = kj::_::
           NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
           ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                         *)local_138);
  TVar4 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
          ::which(pOVar8);
  if (TVar4 == _variant0) {
    pOVar8 = kj::_::
             NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
             ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                           *)local_138);
    local_170 = (AsyncCapabilityStream *)
                OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
                ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done>(pOVar8);
    _kj_switch_done_2 = (Done *)local_170;
    if (local_170 == (AsyncCapabilityStream *)0x0) {
      retry._4_4_ = 0x11;
    }
    else {
      local_180.ptr =
           (AsyncCapabilityStream *)
           (local_170->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream;
      local_178 = _kj_switch_subject_1;
      value.capCount = (size_t)_kj_switch_subject_1;
      value.byteCount = (size_t)local_180.ptr;
      Promise<kj::AsyncCapabilityStream::ReadResult>::Promise
                ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,value);
      retry._4_4_ = 1;
    }
  }
  else {
    if (TVar4 == _variant1) {
      pOVar8 = kj::_::
               NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
               ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                             *)local_138);
      local_1a0._8_8_ =
           OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
           ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>(pOVar8);
      _kj_switch_done_3 = (Retry *)local_1a0._8_8_;
      if ((Retry *)local_1a0._8_8_ != (Retry *)0x0) {
        AsyncPipe::tryReadWithFds
                  ((AsyncPipe *)local_1a0,*(void **)((long)buffer + 0x18),
                   (size_t)((Retry *)local_1a0._8_8_)->buffer,((Retry *)local_1a0._8_8_)->minBytes,
                   (OwnFd *)((Retry *)local_1a0._8_8_)->maxBytes,capCount);
        Promise<kj::AsyncCapabilityStream::ReadResult>::
        then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda(kj::AsyncCapabilityStream::ReadResult)_1_>
                  ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,(Type *)local_1a0);
        Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise
                  ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_1a0);
        retry._4_4_ = 1;
        goto LAB_008a9a0e;
      }
    }
    retry._4_4_ = 0;
  }
LAB_008a9a0e:
  kj::_::
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
  ::~NullableValue((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>_>
                    *)local_138);
  if ((retry._4_4_ != 0) && (retry._4_4_ == 1)) {
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::unreachable();
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* buffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      size_t capCount = 0;
      {  // TODO(cleanup): Remove redundant braces when we update to C++17.
        KJ_SWITCH_ONEOF(capBuffer) {
          KJ_CASE_ONEOF(fds, ArrayPtr<const int>) {
            capCount = kj::max(fds.size(), maxFds);
            // Unfortunately, we have to dup() each FD, because the writer doesn't release ownership
            // by default.
            // TODO(perf): Should we add an ownership-releasing version of writeWithFds()?
            for (auto i: kj::zeroTo(capCount)) {
              fdBuffer[i] = KJ_SYSCALL_FD(dup(fds[i]));
            }
            fdBuffer += capCount;
            maxFds -= capCount;
          }
          KJ_CASE_ONEOF(streams, Array<Own<AsyncCapabilityStream>>) {
            if (streams.size() > 0 && maxFds > 0) {
              // TODO(someday): We could let people pass a LowLevelAsyncIoProvider to
              //   newTwoWayPipe() if we wanted to auto-wrap FDs, but does anyone care?
              KJ_FAIL_REQUIRE(
                  "async pipe message was written with streams attached, but corresponding read "
                  "asked for FDs, and we don't know how to convert here");
            }
          }
        }
      }

      // Drop any unclaimed caps. This mirrors the behavior of unix sockets, where if we didn't
      // provide enough buffer space for all the written FDs, the remaining ones are lost.
      capBuffer = {};

      KJ_SWITCH_ONEOF(tryReadImpl(buffer, minBytes, maxBytes)) {
        KJ_CASE_ONEOF(done, Done) {
          return ReadResult { done.result, capCount };
        }
        KJ_CASE_ONEOF(retry, Retry) {
          return pipe.tryReadWithFds(
              retry.buffer, retry.minBytes, retry.maxBytes, fdBuffer, maxFds)
              .then([byteCount = retry.alreadyRead, capCount](ReadResult result) {
            result.byteCount += byteCount;
            result.capCount += capCount;
            return result;
          });
        }
      }
      KJ_UNREACHABLE;
    }